

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ir_context.cpp
# Opt level: O2

bool __thiscall
spvtools::opt::IRContext::ReplaceAllUsesWithPredicate
          (IRContext *this,uint32_t before,uint32_t after,
          function<bool_(spvtools::opt::Instruction_*)> *predicate)

{
  uint uVar1;
  Instruction *inst;
  uint32_t uVar2;
  uint32_t uVar3;
  DebugInfoManager *this_00;
  DefUseManager *pDVar4;
  Instruction *pIVar5;
  uint uVar6;
  char *message;
  uint32_t in_operand_pos;
  pointer ppVar7;
  initializer_list<unsigned_int> init_list;
  uint32_t local_84;
  pointer local_80;
  vector<std::pair<spvtools::opt::Instruction_*,_unsigned_int>,_std::allocator<std::pair<spvtools::opt::Instruction_*,_unsigned_int>_>_>
  uses_to_update;
  _Any_data local_58;
  code *pcStack_48;
  code *local_40;
  
  if (before != after) {
    if ((this->valid_analyses_ & kAnalysisDebugInfo) != kAnalysisNone) {
      this_00 = get_debug_info_mgr(this);
      analysis::DebugInfoManager::ReplaceAllUsesInDebugScopeWithPredicate
                (this_00,before,after,predicate);
    }
    pDVar4 = get_def_use_mgr(this);
    pIVar5 = analysis::DefUseManager::GetDef(pDVar4,after);
    if (pIVar5 == (Instruction *)0x0) {
      __assert_fail("get_def_use_mgr()->GetDef(after) && \"\'after\' is not a registered def.\"",
                    "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/ir_context.cpp"
                    ,0x148,
                    "bool spvtools::opt::IRContext::ReplaceAllUsesWithPredicate(uint32_t, uint32_t, const std::function<bool (Instruction *)> &)"
                   );
    }
    uses_to_update.
    super__Vector_base<std::pair<spvtools::opt::Instruction_*,_unsigned_int>,_std::allocator<std::pair<spvtools::opt::Instruction_*,_unsigned_int>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    uses_to_update.
    super__Vector_base<std::pair<spvtools::opt::Instruction_*,_unsigned_int>,_std::allocator<std::pair<spvtools::opt::Instruction_*,_unsigned_int>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    uses_to_update.
    super__Vector_base<std::pair<spvtools::opt::Instruction_*,_unsigned_int>,_std::allocator<std::pair<spvtools::opt::Instruction_*,_unsigned_int>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    pDVar4 = get_def_use_mgr(this);
    local_40 = std::
               _Function_handler<void_(spvtools::opt::Instruction_*,_unsigned_int),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/ir_context.cpp:332:15)>
               ::_M_invoke;
    pcStack_48 = std::
                 _Function_handler<void_(spvtools::opt::Instruction_*,_unsigned_int),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/ir_context.cpp:332:15)>
                 ::_M_manager;
    local_58._M_unused._M_object = predicate;
    local_58._8_8_ = &uses_to_update;
    analysis::DefUseManager::ForEachUse
              (pDVar4,before,
               (function<void_(spvtools::opt::Instruction_*,_unsigned_int)> *)&local_58);
    if (pcStack_48 != (code *)0x0) {
      (*pcStack_48)(&local_58,&local_58,3);
    }
    local_80 = uses_to_update.
               super__Vector_base<std::pair<spvtools::opt::Instruction_*,_unsigned_int>,_std::allocator<std::pair<spvtools::opt::Instruction_*,_unsigned_int>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
    pIVar5 = (Instruction *)0x0;
    for (ppVar7 = uses_to_update.
                  super__Vector_base<std::pair<spvtools::opt::Instruction_*,_unsigned_int>,_std::allocator<std::pair<spvtools::opt::Instruction_*,_unsigned_int>_>_>
                  ._M_impl.super__Vector_impl_data._M_start; ppVar7 != local_80; ppVar7 = ppVar7 + 1
        ) {
      inst = ppVar7->first;
      uVar1 = ppVar7->second;
      if (pIVar5 == (Instruction *)0x0 || pIVar5 != inst) {
        ForgetUses(this,inst);
        pIVar5 = inst;
      }
      uVar2 = Instruction::result_id(inst);
      uVar3 = Instruction::type_id(inst);
      uVar6 = ((uVar3 != 0) + 1) - (uint)(uVar2 == 0);
      if (uVar1 < uVar6) {
        uVar2 = Instruction::type_id(inst);
        if ((uVar2 == 0) || (uVar1 != 0)) {
          uVar2 = Instruction::type_id(inst);
          if (uVar2 == 0) {
            local_58._M_unused._M_member_pointer = 0x165;
            message = 
            "assertion failed: Result type id considered as use while the instruction doesn\'t have a result type id."
            ;
          }
          else {
            local_58._M_unused._M_member_pointer = 0x169;
            message = "assertion failed: Trying setting the immutable result id.";
          }
          pcStack_48 = (code *)0x0;
          local_58._8_8_ = 0;
          Log(&this->consumer_,SPV_MSG_INTERNAL_ERROR,
              "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/ir_context.cpp"
              ,(spv_position_t *)&local_58,message);
          exit(1);
        }
        Instruction::SetResultType(inst,after);
      }
      else {
        init_list._M_len = 1;
        init_list._M_array = &local_84;
        local_84 = after;
        utils::SmallVector<unsigned_int,_2UL>::SmallVector
                  ((SmallVector<unsigned_int,_2UL> *)&local_58,init_list);
        Instruction::SetInOperand(inst,uVar1 - uVar6,(OperandData *)&local_58);
        utils::SmallVector<unsigned_int,_2UL>::~SmallVector
                  ((SmallVector<unsigned_int,_2UL> *)&local_58);
      }
      AnalyzeUses(this,inst);
    }
    std::
    _Vector_base<std::pair<spvtools::opt::Instruction_*,_unsigned_int>,_std::allocator<std::pair<spvtools::opt::Instruction_*,_unsigned_int>_>_>
    ::~_Vector_base(&uses_to_update.
                     super__Vector_base<std::pair<spvtools::opt::Instruction_*,_unsigned_int>,_std::allocator<std::pair<spvtools::opt::Instruction_*,_unsigned_int>_>_>
                   );
  }
  return before != after;
}

Assistant:

bool IRContext::ReplaceAllUsesWithPredicate(
    uint32_t before, uint32_t after,
    const std::function<bool(Instruction*)>& predicate) {
  if (before == after) return false;

  if (AreAnalysesValid(kAnalysisDebugInfo)) {
    get_debug_info_mgr()->ReplaceAllUsesInDebugScopeWithPredicate(before, after,
                                                                  predicate);
  }

  // Ensure that |after| has been registered as def.
  assert(get_def_use_mgr()->GetDef(after) &&
         "'after' is not a registered def.");

  std::vector<std::pair<Instruction*, uint32_t>> uses_to_update;
  get_def_use_mgr()->ForEachUse(
      before, [&predicate, &uses_to_update](Instruction* user, uint32_t index) {
        if (predicate(user)) {
          uses_to_update.emplace_back(user, index);
        }
      });

  Instruction* prev = nullptr;
  for (auto p : uses_to_update) {
    Instruction* user = p.first;
    uint32_t index = p.second;
    if (prev == nullptr || prev != user) {
      ForgetUses(user);
      prev = user;
    }
    const uint32_t type_result_id_count =
        (user->result_id() != 0) + (user->type_id() != 0);

    if (index < type_result_id_count) {
      // Update the type_id. Note that result id is immutable so it should
      // never be updated.
      if (user->type_id() != 0 && index == 0) {
        user->SetResultType(after);
      } else if (user->type_id() == 0) {
        SPIRV_ASSERT(consumer_, false,
                     "Result type id considered as use while the instruction "
                     "doesn't have a result type id.");
        (void)consumer_;  // Makes the compiler happy for release build.
      } else {
        SPIRV_ASSERT(consumer_, false,
                     "Trying setting the immutable result id.");
      }
    } else {
      // Update an in-operand.
      uint32_t in_operand_pos = index - type_result_id_count;
      // Make the modification in the instruction.
      user->SetInOperand(in_operand_pos, {after});
    }
    AnalyzeUses(user);
  }
  return true;
}